

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockNodePreviewDockRender
               (ImGuiWindow *host_window,ImGuiDockNode *host_node,ImGuiWindow *root_payload,
               ImGuiDockPreviewData *data)

{
  ImVector<ImGuiWindow_*> *this;
  ulong uVar1;
  float *pfVar2;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  ImU32 IVar5;
  ImU32 col;
  ImU32 col_00;
  ImGuiWindow **ppIVar6;
  ImGuiTabItem *pIVar7;
  ImRect *pIVar8;
  int i;
  ImGuiDockNode *pIVar9;
  ImGuiDockNode *pIVar10;
  ImGuiWindow *payload;
  int overlay_n_1;
  ulong uVar11;
  char *label;
  int overlay_n;
  long lVar12;
  ImDrawList *pIVar13;
  ImGuiWindow *pIVar14;
  int overlay_n_2;
  uint uVar15;
  bool bVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float alpha_mul;
  long lStackY_150;
  ImRect local_128;
  ImRect overlay_rect;
  undefined1 local_d8 [16];
  ImVec2 local_c0;
  ImVec2 local_b8;
  ImGuiDockNode *local_b0;
  long local_a8;
  ImGuiDockNode *local_a0;
  int local_94;
  ImU32 local_90;
  ImU32 local_8c;
  undefined1 local_88 [16];
  ImDrawList *overlay_draw_lists [2];
  ImGuiTabBar *local_60;
  
  pIVar4 = GImGui;
  local_88._8_8_ = local_88._0_8_;
  local_b0 = host_node;
  if (GImGui->CurrentWindow != host_window) {
    __assert_fail("g.CurrentWindow == host_window",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x39da,
                  "void ImGui::DockNodePreviewDockRender(ImGuiWindow *, ImGuiDockNode *, ImGuiWindow *, const ImGuiDockPreviewData *)"
                 );
  }
  bVar16 = (GImGui->IO).ConfigDockingTransparentPayload;
  overlay_draw_lists[0] = GetForegroundDrawList(&host_window->Viewport->super_ImGuiViewport);
  if (host_window->Viewport == root_payload->Viewport || (bVar16 & 1U) != 0) {
    lStackY_150 = 1;
  }
  else {
    overlay_draw_lists[1] = GetForegroundDrawList(&root_payload->Viewport->super_ImGuiViewport);
    lStackY_150 = 2;
  }
  local_a8 = lStackY_150;
  fVar18 = 0.6;
  fVar17 = 0.6;
  bVar16 = (bVar16 & 1U) == 0;
  if (bVar16) {
    fVar17 = 0.4;
    fVar19 = 0.7;
    alpha_mul = 1.0;
  }
  else {
    fVar19 = 0.9;
    alpha_mul = 1.2;
  }
  local_88._0_8_ = root_payload;
  if (!bVar16) {
    fVar18 = 0.8;
  }
  IVar5 = GetColorU32(0x26,fVar17);
  local_8c = GetColorU32(0x26,fVar19);
  local_90 = GetColorU32(0x26,alpha_mul);
  col = GetColorU32(0x34,fVar18);
  if (*(long *)(local_88._0_8_ + 0x408) == 0) {
    bVar16 = false;
  }
  else {
    bVar16 = *(int *)(*(long *)(local_88._0_8_ + 0x408) + 0x30) < 1;
  }
  if (data->IsDropAllowed != true) goto LAB_0014187c;
  overlay_rect = ImGuiDockNode::Rect(&data->FutureNode);
  if (data->SplitDir == -1 && !bVar16) {
    fVar17 = (GImGui->Style).FramePadding.y;
    overlay_rect.Min.y = fVar17 + fVar17 + GImGui->FontSize + overlay_rect.Min.y;
LAB_0014146f:
    if (data->IsCenterAvailable == true) goto LAB_00141480;
  }
  else {
    if (data->SplitDir == -1) goto LAB_0014146f;
LAB_00141480:
    for (lVar12 = 0; local_a8 != lVar12; lVar12 = lVar12 + 1) {
      ImDrawList::AddRectFilled
                (overlay_draw_lists[lVar12],&overlay_rect.Min,&overlay_rect.Max,IVar5,
                 host_window->WindowRounding,0);
    }
  }
  if ((((~data->IsDropAllowed & 1U) != 0 || bVar16) || (data->SplitDir != -1)) ||
     (data->IsCenterAvailable != true)) goto LAB_0014187c;
  overlay_rect = (ImRect)ZEXT816(0);
  DockNodeCalcTabBarLayout
            (&data->FutureNode,(ImRect *)0x0,&overlay_rect,(ImVec2 *)0x0,(ImVec2 *)0x0);
  fVar17 = overlay_rect.Min.x;
  fVar18 = overlay_rect.Min.y;
  pIVar14 = (ImGuiWindow *)local_88._0_8_;
  if ((local_b0 == (ImGuiDockNode *)0x0) || (local_b0->TabBar == (ImGuiTabBar *)0x0)) {
    if ((host_window->Flags & 0x20000000) == 0) {
      fVar19 = (pIVar4->Style).ItemInnerSpacing.x;
      label = host_window->Name;
      bVar16 = host_window->HasCloseButton;
      goto LAB_001415d7;
    }
  }
  else {
    if ((local_b0->MergedFlags & 0x3000) == 0) {
      fVar19 = local_b0->TabBar->WidthAllTabs + (pIVar4->Style).ItemInnerSpacing.x;
    }
    else {
      fVar19 = (pIVar4->Style).ItemInnerSpacing.x;
      this = &local_b0->Windows;
      ppIVar6 = ImVector<ImGuiWindow_*>::operator[](this,0);
      label = (*ppIVar6)->Name;
      ppIVar6 = ImVector<ImGuiWindow_*>::operator[](this,0);
      bVar16 = (*ppIVar6)->HasCloseButton;
LAB_001415d7:
      IVar3 = TabItemCalcSize(label,bVar16);
      fVar19 = IVar3.x + fVar19;
    }
    fVar17 = fVar17 + fVar19;
  }
  local_d8 = ZEXT416((uint)fVar17);
  local_a0 = *(ImGuiDockNode **)((long)pIVar14 + 0x408);
  i = 0;
  if (local_a0 == (ImGuiDockNode *)0x0) {
    local_94 = 1;
    local_60 = (ImGuiTabBar *)0x0;
  }
  else {
    local_60 = local_a0->TabBar;
    local_94 = (local_60->Tabs).Size;
    if (local_94 < (local_a0->Windows).Size) {
      __assert_fail("root_payload->DockNodeAsHost->Windows.Size <= root_payload->DockNodeAsHost->TabBar->Tabs.Size"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x3a0e,
                    "void ImGui::DockNodePreviewDockRender(ImGuiWindow *, ImGuiDockNode *, ImGuiWindow *, const ImGuiDockPreviewData *)"
                   );
    }
  }
  if (local_94 < 1) {
    local_94 = i;
  }
  for (; i != local_94; i = i + 1) {
    payload = pIVar14;
    if (local_a0 == (ImGuiDockNode *)0x0) {
LAB_00141695:
      bVar16 = DockNodeIsDropAllowedOne(payload,host_window);
      if (bVar16) {
        IVar3 = TabItemCalcSize(payload->Name,payload->HasCloseButton);
        local_128.Min.y = fVar18;
        local_128.Min.x = (float)local_d8._0_4_;
        local_128.Max.y = fVar18 + IVar3.y;
        local_128.Max.x = (float)local_d8._0_4_ + IVar3.x;
        fVar17 = (pIVar4->Style).ItemInnerSpacing.x;
        IVar5 = GetColorU32((payload->DockStyle).Colors[0]);
        col_00 = GetColorU32((payload->DockStyle).Colors[3]);
        PushStyleColor(0,IVar5);
        for (lVar12 = 0; local_a8 != lVar12; lVar12 = lVar12 + 1) {
          uVar15 = payload->Flags;
          if (local_128.Min.x < overlay_rect.Min.x) {
LAB_00141767:
            pIVar13 = overlay_draw_lists[lVar12];
            ImDrawList::PushClipRect(pIVar13,overlay_rect.Min,overlay_rect.Max,false);
          }
          else {
            if (local_128.Min.y < overlay_rect.Min.y) goto LAB_00141767;
            if (overlay_rect.Max.x < local_128.Max.x) goto LAB_00141767;
            if (overlay_rect.Max.y < local_128.Max.y) goto LAB_00141767;
            pIVar13 = overlay_draw_lists[lVar12];
          }
          uVar15 = uVar15 >> 0x14 & 1 | 0x800000;
          TabItemBackground(pIVar13,&local_128,uVar15,col_00);
          TabItemLabelAndCloseButton
                    (pIVar13,&local_128,uVar15,(pIVar4->Style).FramePadding,payload->Name,0,0,false,
                     (bool *)0x0,(bool *)0x0);
          if (local_128.Min.x < overlay_rect.Min.x) {
LAB_0014180f:
            ImDrawList::PopClipRect(pIVar13);
          }
          else {
            if (local_128.Min.y < overlay_rect.Min.y) goto LAB_0014180f;
            if (overlay_rect.Max.x < local_128.Max.x) goto LAB_0014180f;
            if (overlay_rect.Max.y < local_128.Max.y) goto LAB_0014180f;
          }
        }
        local_d8._0_4_ = (float)local_d8._0_4_ + IVar3.x + fVar17;
        PopStyleColor(1);
        pIVar14 = (ImGuiWindow *)local_88._0_8_;
      }
    }
    else {
      pIVar7 = ImVector<ImGuiTabItem>::operator[](&local_60->Tabs,i);
      payload = pIVar7->Window;
      if (payload != (ImGuiWindow *)0x0) goto LAB_00141695;
    }
  }
LAB_0014187c:
  fVar17 = (pIVar4->Style).FrameRounding;
  fVar18 = 3.0;
  if (3.0 <= fVar17) {
    fVar18 = fVar17;
  }
  pIVar10 = (ImGuiDockNode *)data->DropRectsDraw;
  pIVar9 = local_b0;
  uVar11 = 0xffffffffffffffff;
  local_a0 = pIVar10;
  while( true ) {
    if (uVar11 == 4) {
      return;
    }
    uVar1 = uVar11 + 1;
    fVar17 = (((ImRect *)((long)pIVar10 + uVar1 * 0x10))->Min).x;
    if ((fVar17 < (((ImRect *)((long)pIVar10 + uVar1 * 0x10))->Max).x ||
         fVar17 == (((ImRect *)((long)pIVar10 + uVar1 * 0x10))->Max).x) &&
       (fVar17 = (((ImRect *)((long)pIVar10 + uVar1 * 0x10))->Min).y,
       pfVar2 = &(((ImRect *)((long)pIVar10 + uVar1 * 0x10))->Max).y,
       fVar17 < *pfVar2 || fVar17 == *pfVar2)) {
      pIVar8 = (ImRect *)((long)pIVar10 + uVar1 * 0x10);
      overlay_rect = *pIVar8;
      local_128.Min.x = (pIVar8->Min).x;
      local_128.Min.y = (pIVar8->Min).y;
      local_128.Max.x = (pIVar8->Max).x;
      local_128.Max.y = (pIVar8->Max).y;
      local_128.Min.x = local_128.Min.x + 2.0;
      local_128.Min.y = local_128.Min.y + 2.0;
      local_128.Max.x = local_128.Max.x + -2.0;
      local_128.Max.y = local_128.Max.y + -2.0;
      if ((data->SplitDir != (uint)uVar11) || (IVar5 = local_90, data->IsSplitDirExplicit == false))
      {
        IVar5 = local_8c;
      }
      for (lVar12 = 0; fVar17 = local_128.Max.x, pIVar9 = local_b0, pIVar10 = local_a0,
          local_a8 != lVar12; lVar12 = lVar12 + 1) {
        local_88 = ZEXT416((uint)local_128.Min.x);
        fVar19 = local_128.Min.y + local_128.Max.y;
        pIVar13 = overlay_draw_lists[lVar12];
        ImDrawList::AddRectFilled(pIVar13,&overlay_rect.Min,&overlay_rect.Max,IVar5,fVar18,0);
        ImDrawList::AddRect(pIVar13,&local_128.Min,&local_128.Max,col,fVar18,0,1.0);
        if (uVar11 < 2) {
          local_c0.x = (float)(int)(((float)local_88._0_4_ + fVar17) * 0.5);
          local_b8.y = local_128.Min.y;
          local_c0.y = local_128.Max.y;
          local_b8.x = local_c0.x;
          ImDrawList::AddLine(pIVar13,&local_b8,&local_c0,col,1.0);
        }
        if (((uint)uVar11 & 0xfffffffe) == 2) {
          local_c0.y = (float)(int)(fVar19 * 0.5);
          local_b8.x = local_128.Min.x;
          local_c0.x = local_128.Max.x;
          local_b8.y = local_c0.y;
          ImDrawList::AddLine(pIVar13,&local_b8,&local_c0,col,1.0);
        }
      }
    }
    if ((pIVar9 != (ImGuiDockNode *)0x0) && ((pIVar9->MergedFlags & 0x10) != 0)) break;
    uVar11 = uVar1;
    if ((pIVar4->IO).ConfigDockingNoSplit == true) {
      return;
    }
  }
  return;
}

Assistant:

static void ImGui::DockNodePreviewDockRender(ImGuiWindow* host_window, ImGuiDockNode* host_node, ImGuiWindow* root_payload, const ImGuiDockPreviewData* data)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.CurrentWindow == host_window);   // Because we rely on font size to calculate tab sizes

    // With this option, we only display the preview on the target viewport, and the payload viewport is made transparent.
    // To compensate for the single layer obstructed by the payload, we'll increase the alpha of the preview nodes.
    const bool is_transparent_payload = g.IO.ConfigDockingTransparentPayload;

    // In case the two windows involved are on different viewports, we will draw the overlay on each of them.
    int overlay_draw_lists_count = 0;
    ImDrawList* overlay_draw_lists[2];
    overlay_draw_lists[overlay_draw_lists_count++] = GetForegroundDrawList(host_window->Viewport);
    if (host_window->Viewport != root_payload->Viewport && !is_transparent_payload)
        overlay_draw_lists[overlay_draw_lists_count++] = GetForegroundDrawList(root_payload->Viewport);

    // Draw main preview rectangle
    const ImU32 overlay_col_main = GetColorU32(ImGuiCol_DockingPreview, is_transparent_payload ? 0.60f : 0.40f);
    const ImU32 overlay_col_drop = GetColorU32(ImGuiCol_DockingPreview, is_transparent_payload ? 0.90f : 0.70f);
    const ImU32 overlay_col_drop_hovered = GetColorU32(ImGuiCol_DockingPreview, is_transparent_payload ? 1.20f : 1.00f);
    const ImU32 overlay_col_lines = GetColorU32(ImGuiCol_NavWindowingHighlight, is_transparent_payload ? 0.80f : 0.60f);

    // Display area preview
    const bool can_preview_tabs = (root_payload->DockNodeAsHost == NULL || root_payload->DockNodeAsHost->Windows.Size > 0);
    if (data->IsDropAllowed)
    {
        ImRect overlay_rect = data->FutureNode.Rect();
        if (data->SplitDir == ImGuiDir_None && can_preview_tabs)
            overlay_rect.Min.y += GetFrameHeight();
        if (data->SplitDir != ImGuiDir_None || data->IsCenterAvailable)
            for (int overlay_n = 0; overlay_n < overlay_draw_lists_count; overlay_n++)
                overlay_draw_lists[overlay_n]->AddRectFilled(overlay_rect.Min, overlay_rect.Max, overlay_col_main, host_window->WindowRounding);
    }

    // Display tab shape/label preview unless we are splitting node (it generally makes the situation harder to read)
    if (data->IsDropAllowed && can_preview_tabs && data->SplitDir == ImGuiDir_None && data->IsCenterAvailable)
    {
        // Compute target tab bar geometry so we can locate our preview tabs
        ImRect tab_bar_rect;
        DockNodeCalcTabBarLayout(&data->FutureNode, NULL, &tab_bar_rect, NULL, NULL);
        ImVec2 tab_pos = tab_bar_rect.Min;
        if (host_node && host_node->TabBar)
        {
            if (!host_node->IsHiddenTabBar() && !host_node->IsNoTabBar())
                tab_pos.x += host_node->TabBar->WidthAllTabs + g.Style.ItemInnerSpacing.x; // We don't use OffsetNewTab because when using non-persistent-order tab bar it is incremented with each Tab submission.
            else
                tab_pos.x += g.Style.ItemInnerSpacing.x + TabItemCalcSize(host_node->Windows[0]->Name, host_node->Windows[0]->HasCloseButton).x;
        }
        else if (!(host_window->Flags & ImGuiWindowFlags_DockNodeHost))
        {
            tab_pos.x += g.Style.ItemInnerSpacing.x + TabItemCalcSize(host_window->Name, host_window->HasCloseButton).x; // Account for slight offset which will be added when changing from title bar to tab bar
        }

        // Draw tab shape/label preview (payload may be a loose window or a host window carrying multiple tabbed windows)
        if (root_payload->DockNodeAsHost)
            IM_ASSERT(root_payload->DockNodeAsHost->Windows.Size <= root_payload->DockNodeAsHost->TabBar->Tabs.Size);
        ImGuiTabBar* tab_bar_with_payload = root_payload->DockNodeAsHost ? root_payload->DockNodeAsHost->TabBar : NULL;
        const int payload_count = tab_bar_with_payload ? tab_bar_with_payload->Tabs.Size : 1;
        for (int payload_n = 0; payload_n < payload_count; payload_n++)
        {
            // DockNode's TabBar may have non-window Tabs manually appended by user
            ImGuiWindow* payload_window = tab_bar_with_payload ? tab_bar_with_payload->Tabs[payload_n].Window : root_payload;
            if (tab_bar_with_payload && payload_window == NULL)
                continue;
            if (!DockNodeIsDropAllowedOne(payload_window, host_window))
                continue;

            // Calculate the tab bounding box for each payload window
            ImVec2 tab_size = TabItemCalcSize(payload_window->Name, payload_window->HasCloseButton);
            ImRect tab_bb(tab_pos.x, tab_pos.y, tab_pos.x + tab_size.x, tab_pos.y + tab_size.y);
            tab_pos.x += tab_size.x + g.Style.ItemInnerSpacing.x;
            const ImU32 overlay_col_text = GetColorU32(payload_window->DockStyle.Colors[ImGuiWindowDockStyleCol_Text]);
            const ImU32 overlay_col_tabs = GetColorU32(payload_window->DockStyle.Colors[ImGuiWindowDockStyleCol_TabActive]);
            PushStyleColor(ImGuiCol_Text, overlay_col_text);
            for (int overlay_n = 0; overlay_n < overlay_draw_lists_count; overlay_n++)
            {
                ImGuiTabItemFlags tab_flags = ImGuiTabItemFlags_Preview | ((payload_window->Flags & ImGuiWindowFlags_UnsavedDocument) ? ImGuiTabItemFlags_UnsavedDocument : 0);
                if (!tab_bar_rect.Contains(tab_bb))
                    overlay_draw_lists[overlay_n]->PushClipRect(tab_bar_rect.Min, tab_bar_rect.Max);
                TabItemBackground(overlay_draw_lists[overlay_n], tab_bb, tab_flags, overlay_col_tabs);
                TabItemLabelAndCloseButton(overlay_draw_lists[overlay_n], tab_bb, tab_flags, g.Style.FramePadding, payload_window->Name, 0, 0, false, NULL, NULL);
                if (!tab_bar_rect.Contains(tab_bb))
                    overlay_draw_lists[overlay_n]->PopClipRect();
            }
            PopStyleColor();
        }
    }

    // Display drop boxes
    const float overlay_rounding = ImMax(3.0f, g.Style.FrameRounding);
    for (int dir = ImGuiDir_None; dir < ImGuiDir_COUNT; dir++)
    {
        if (!data->DropRectsDraw[dir + 1].IsInverted())
        {
            ImRect draw_r = data->DropRectsDraw[dir + 1];
            ImRect draw_r_in = draw_r;
            draw_r_in.Expand(-2.0f);
            ImU32 overlay_col = (data->SplitDir == (ImGuiDir)dir && data->IsSplitDirExplicit) ? overlay_col_drop_hovered : overlay_col_drop;
            for (int overlay_n = 0; overlay_n < overlay_draw_lists_count; overlay_n++)
            {
                ImVec2 center = ImFloor(draw_r_in.GetCenter());
                overlay_draw_lists[overlay_n]->AddRectFilled(draw_r.Min, draw_r.Max, overlay_col, overlay_rounding);
                overlay_draw_lists[overlay_n]->AddRect(draw_r_in.Min, draw_r_in.Max, overlay_col_lines, overlay_rounding);
                if (dir == ImGuiDir_Left || dir == ImGuiDir_Right)
                    overlay_draw_lists[overlay_n]->AddLine(ImVec2(center.x, draw_r_in.Min.y), ImVec2(center.x, draw_r_in.Max.y), overlay_col_lines);
                if (dir == ImGuiDir_Up || dir == ImGuiDir_Down)
                    overlay_draw_lists[overlay_n]->AddLine(ImVec2(draw_r_in.Min.x, center.y), ImVec2(draw_r_in.Max.x, center.y), overlay_col_lines);
            }
        }

        // Stop after ImGuiDir_None
        if ((host_node && (host_node->MergedFlags & ImGuiDockNodeFlags_NoSplit)) || g.IO.ConfigDockingNoSplit)
            return;
    }
}